

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ImGuiTabBar *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImU32 col;
  uint uVar9;
  size_t __nmemb;
  ImDrawList *this;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImPoolIdx local_38;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  bVar3 = pIVar4->SkipItems;
  if (bVar3 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar5 = (GImGui->TabBars).Buf.Data;
    local_38 = -1;
    local_40 = (undefined1  [8])tab_bar;
    if ((pIVar5 <= tab_bar) && (tab_bar < pIVar5 + (GImGui->TabBars).Buf.Size)) {
      local_38 = ImPool<ImGuiTabBar>::GetIndex(&GImGui->TabBars,tab_bar);
      local_40._0_4_ = 0.0;
      local_40._4_4_ = 0.0;
    }
    ImVector<ImGuiPtrOrIndex>::push_back(&pIVar7->CurrentTabBarStack,(ImGuiPtrOrIndex *)local_40);
    pIVar7->CurrentTabBar = tab_bar;
    tab_bar->BackupCursorPos = (pIVar4->DC).CursorPos;
    iVar8 = tab_bar->CurrFrameVisible;
    if (iVar8 == pIVar7->FrameCount) {
      fVar1 = (tab_bar->BarRect).Max.y;
      fVar2 = tab_bar->ItemSpacingY;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar4->DC).CursorPos.y = fVar1 + fVar2;
      tab_bar->BeginCount = tab_bar->BeginCount + '\x01';
    }
    else {
      if ((((flags & 1U) != (tab_bar->Flags & 1U)) ||
          (((flags & 1U) == 0 && (tab_bar->TabsAddedNew != false)))) &&
         (__nmemb = (size_t)(tab_bar->Tabs).Size,
         1 < (long)__nmemb && ((uint)flags >> 0x14 & 1) == 0)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x30,TabItemComparerByBeginOrder);
        iVar8 = tab_bar->CurrFrameVisible;
      }
      tab_bar->TabsAddedNew = false;
      uVar9 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar9 = flags;
      }
      tab_bar->Flags = uVar9;
      IVar6 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar6;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = iVar8;
      tab_bar->CurrFrameVisible = pIVar7->FrameCount;
      tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
      tab_bar->CurrTabsContentsHeight = 0.0;
      fVar1 = (pIVar7->Style).ItemSpacing.y;
      tab_bar->ItemSpacingY = fVar1;
      tab_bar->FramePadding = (pIVar7->Style).FramePadding;
      tab_bar->TabsActiveCount = 0;
      tab_bar->BeginCount = '\x01';
      fVar2 = (tab_bar->BarRect).Max.y;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar4->DC).CursorPos.y = fVar1 + fVar2;
      col = GetColorU32((uint)((uVar9 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      local_48.y = (tab_bar->BarRect).Max.y + -1.0;
      if (dock_node == (ImGuiDockNode *)0x0) {
        local_48.x = (float)(int)((pIVar4->WindowPadding).x * 0.5);
        local_40._0_4_ = (tab_bar->BarRect).Min.x - local_48.x;
        local_48.x = (tab_bar->BarRect).Max.x + local_48.x;
        this = pIVar4->DrawList;
      }
      else {
        fVar1 = (dock_node->Pos).x;
        local_40._0_4_ = fVar1 + pIVar4->WindowBorderSize;
        local_48.x = (fVar1 + (dock_node->Size).x) - pIVar4->WindowBorderSize;
        this = pIVar4->DrawList;
      }
      local_40._4_4_ = local_48.y;
      ImDrawList::AddLine(this,(ImVec2 *)local_40,&local_48,col,1.0);
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        if (tab_bar->Tabs.Size > 1 && (flags & ImGuiTabBarFlags_DockNode) == 0) // FIXME: TabBar with DockNode can now be hybrid
            ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}